

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglshaderprogram.cpp
# Opt level: O0

void __thiscall
QOpenGLShaderProgram::setUniformValueArray
          (QOpenGLShaderProgram *this,int location,QMatrix4x4 *values,int count)

{
  QOpenGLShaderProgramPrivate *pQVar1;
  float *pfVar2;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_FS_OFFSET;
  int index2;
  int index;
  QOpenGLShaderProgramPrivate *d;
  QVarLengthArray<float,_256LL> temp;
  qsizetype in_stack_fffffffffffffb98;
  QOpenGLExtraFunctions *value;
  undefined4 in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba4;
  float in_stack_fffffffffffffbac;
  int in_stack_fffffffffffffbb0;
  int iVar3;
  QVLABase<float> local_420 [43];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QOpenGLShaderProgram *)0x1783f8);
  if ((in_ESI != -1) && (0 < in_ECX)) {
    memset(local_420,0xaa,0x418);
    QVarLengthArray<float,_256LL>::QVarLengthArray
              ((QVarLengthArray<float,_256LL> *)
               CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
               in_stack_fffffffffffffb98);
    for (iVar3 = 0; iVar3 < in_ECX; iVar3 = iVar3 + 1) {
      for (in_stack_fffffffffffffbb0 = 0; in_stack_fffffffffffffbb0 < 0x10;
          in_stack_fffffffffffffbb0 = in_stack_fffffffffffffbb0 + 1) {
        pfVar2 = QMatrix4x4::constData((QMatrix4x4 *)(in_RDX + (long)iVar3 * 0x44));
        in_stack_fffffffffffffbac = pfVar2[in_stack_fffffffffffffbb0];
        pfVar2 = QVLABase<float>::data(local_420);
        pfVar2[iVar3 * 0x10 + in_stack_fffffffffffffbb0] = in_stack_fffffffffffffbac;
      }
    }
    value = pQVar1->glfuncs;
    QVarLengthArray<float,_256LL>::constData((QVarLengthArray<float,_256LL> *)0x1784e8);
    QOpenGLFunctions::glUniformMatrix4fv
              ((QOpenGLFunctions *)CONCAT44(iVar3,in_stack_fffffffffffffbb0),
               (GLint)in_stack_fffffffffffffbac,in_ECX,(GLboolean)((uint)in_ESI >> 0x18),
               (GLfloat *)value);
    QVarLengthArray<float,_256LL>::~QVarLengthArray
              ((QVarLengthArray<float,_256LL> *)CONCAT44(in_ESI,in_stack_fffffffffffffba0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QOpenGLShaderProgram::setUniformValueArray(int location, const QMatrix4x4 *values, int count)
{
    Q_D(QOpenGLShaderProgram);
    Q_UNUSED(d);
    setUniformMatrixArray
        (d->glfuncs->glUniformMatrix4fv, location, values, count, QMatrix4x4, 4, 4);
}